

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall tcu::TextureLevelPyramid::clearLevel(TextureLevelPyramid *this,int levelNdx)

{
  TextureFormat *pTVar1;
  int *piVar2;
  pointer pPVar3;
  undefined1 local_40 [24];
  int aiStack_28 [2];
  void *local_20;
  
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear
            ((this->m_data).
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start + levelNdx);
  ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_40);
  pPVar3 = (this->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar3[levelNdx].super_ConstPixelBufferAccess.m_data = local_20;
  piVar2 = (int *)((long)pPVar3[levelNdx].super_ConstPixelBufferAccess.m_size.m_data + 8);
  *(undefined8 *)piVar2 = local_40._16_8_;
  *(int (*) [2])(piVar2 + 2) = aiStack_28;
  pTVar1 = (TextureFormat *)(pPVar3 + levelNdx);
  pTVar1->order = local_40._0_4_;
  pTVar1->type = local_40._4_4_;
  pTVar1[1].order = local_40._8_4_;
  pTVar1[1].type = local_40._12_4_;
  return;
}

Assistant:

void TextureLevelPyramid::clearLevel (int levelNdx)
{
	DE_ASSERT(!isLevelEmpty(levelNdx));

	m_data[levelNdx].clear();
	m_access[levelNdx] = PixelBufferAccess();
}